

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

void __thiscall SerialTaskRunner::MaybeScheduleProcessQueue(SerialTaskRunner *this)

{
  bool bVar1;
  undefined1 *puVar2;
  CScheduler *this_00;
  Function f;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  undefined8 uVar3;
  code *pcVar4;
  code *pcVar5;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_38,&this->m_callbacks_mutex,
             "m_callbacks_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp"
             ,0x87,false);
  puVar2 = *(undefined1 **)&this->m_callbacks_pending;
  bVar1 = this->m_are_callbacks_running;
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  if ((bVar1 == false) &&
     ((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)puVar2 !=
      &this->m_callbacks_pending)) {
    this_00 = this->m_scheduler;
    uVar3 = 0;
    pcVar5 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp:142:26)>
             ::_M_invoke;
    pcVar4 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp:142:26)>
             ::_M_manager;
    std::chrono::_V2::steady_clock::now();
    f.super__Function_base._M_functor._8_8_ = uVar3;
    f.super__Function_base._M_functor._M_unused._M_object = this;
    f.super__Function_base._M_manager = pcVar4;
    f._M_invoker = pcVar5;
    CScheduler::schedule(this_00,f,(time_point)&stack0xffffffffffffffa8);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::MaybeScheduleProcessQueue()
{
    {
        LOCK(m_callbacks_mutex);
        // Try to avoid scheduling too many copies here, but if we
        // accidentally have two ProcessQueue's scheduled at once its
        // not a big deal.
        if (m_are_callbacks_running) return;
        if (m_callbacks_pending.empty()) return;
    }
    m_scheduler.schedule([this] { this->ProcessQueue(); }, std::chrono::steady_clock::now());
}